

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O3

void __thiscall Assimp::MDLImporter::SetupProperties(MDLImporter *this,Importer *pImp)

{
  uint uVar1;
  int iVar2;
  string local_60;
  string local_40;
  
  uVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_MDL_KEYFRAME",-1);
  this->configFrameID = uVar1;
  if (uVar1 == 0xffffffff) {
    uVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_GLOBAL_KEYFRAME",0);
    this->configFrameID = uVar1;
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"colormap.lmp","");
  Importer::GetPropertyString(&local_40,pImp,"IMPORT_MDL_COLORMAP",&local_60);
  std::__cxx11::string::_M_assign((string *)&this->configPalette);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  iVar2 = Importer::GetPropertyInteger(pImp,"IMPORT_MDL_HL1_READ_ANIMATIONS",1);
  (this->mHL1ImportSettings).read_animations = iVar2 != 0;
  if (iVar2 != 0) {
    iVar2 = Importer::GetPropertyInteger(pImp,"IMPORT_MDL_HL1_READ_ANIMATION_EVENTS",1);
    (this->mHL1ImportSettings).read_animation_events = iVar2 != 0;
    iVar2 = Importer::GetPropertyInteger(pImp,"IMPORT_MDL_HL1_READ_BLEND_CONTROLLERS",1);
    (this->mHL1ImportSettings).read_blend_controllers = iVar2 != 0;
    iVar2 = Importer::GetPropertyInteger(pImp,"IMPORT_MDL_HL1_READ_SEQUENCE_TRANSITIONS",1);
    (this->mHL1ImportSettings).read_sequence_transitions = iVar2 != 0;
  }
  iVar2 = Importer::GetPropertyInteger(pImp,"IMPORT_MDL_HL1_READ_ATTACHMENTS",1);
  (this->mHL1ImportSettings).read_attachments = iVar2 != 0;
  iVar2 = Importer::GetPropertyInteger(pImp,"IMPORT_MDL_HL1_READ_BONE_CONTROLLERS",1);
  (this->mHL1ImportSettings).read_bone_controllers = iVar2 != 0;
  iVar2 = Importer::GetPropertyInteger(pImp,"IMPORT_MDL_HL1_READ_HITBOXES",1);
  (this->mHL1ImportSettings).read_hitboxes = iVar2 != 0;
  iVar2 = Importer::GetPropertyInteger(pImp,"IMPORT_MDL_HL1_READ_MISC_GLOBAL_INFO",1);
  (this->mHL1ImportSettings).read_misc_global_info = iVar2 != 0;
  return;
}

Assistant:

void MDLImporter::SetupProperties(const Importer* pImp)
{
    configFrameID = pImp->GetPropertyInteger(AI_CONFIG_IMPORT_MDL_KEYFRAME,-1);

    // The
    // AI_CONFIG_IMPORT_MDL_KEYFRAME option overrides the
    // AI_CONFIG_IMPORT_GLOBAL_KEYFRAME option.
    if(static_cast<unsigned int>(-1) == configFrameID)  {
        configFrameID =  pImp->GetPropertyInteger(AI_CONFIG_IMPORT_GLOBAL_KEYFRAME,0);
    }

    // AI_CONFIG_IMPORT_MDL_COLORMAP - palette file
    configPalette =  pImp->GetPropertyString(AI_CONFIG_IMPORT_MDL_COLORMAP,"colormap.lmp");

    // Read configuration specific to MDL (Half-Life 1).
    mHL1ImportSettings.read_animations = pImp->GetPropertyBool(AI_CONFIG_IMPORT_MDL_HL1_READ_ANIMATIONS, true);
    if (mHL1ImportSettings.read_animations) {
        mHL1ImportSettings.read_animation_events = pImp->GetPropertyBool(AI_CONFIG_IMPORT_MDL_HL1_READ_ANIMATION_EVENTS, true);
        mHL1ImportSettings.read_blend_controllers = pImp->GetPropertyBool(AI_CONFIG_IMPORT_MDL_HL1_READ_BLEND_CONTROLLERS, true);
        mHL1ImportSettings.read_sequence_transitions = pImp->GetPropertyBool(AI_CONFIG_IMPORT_MDL_HL1_READ_SEQUENCE_TRANSITIONS, true);
    }
    mHL1ImportSettings.read_attachments = pImp->GetPropertyBool(AI_CONFIG_IMPORT_MDL_HL1_READ_ATTACHMENTS, true);
    mHL1ImportSettings.read_bone_controllers = pImp->GetPropertyBool(AI_CONFIG_IMPORT_MDL_HL1_READ_BONE_CONTROLLERS, true);
    mHL1ImportSettings.read_hitboxes = pImp->GetPropertyBool(AI_CONFIG_IMPORT_MDL_HL1_READ_HITBOXES, true);
    mHL1ImportSettings.read_misc_global_info = pImp->GetPropertyBool(AI_CONFIG_IMPORT_MDL_HL1_READ_MISC_GLOBAL_INFO, true);
}